

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O1

int nni_dialer_getopt(nni_dialer *d,char *name,void *valp,size_t *szp,nni_type t)

{
  _func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *p_Var1;
  nni_option *pnVar2;
  char *__s1;
  int iVar3;
  nng_duration d_00;
  
  iVar3 = strcmp(name,"reconnect-time-max");
  if (iVar3 == 0) {
    nni_mtx_lock(&d->d_mtx);
    d_00 = d->d_maxrtime;
  }
  else {
    iVar3 = strcmp(name,"reconnect-time-min");
    if (iVar3 != 0) {
      p_Var1 = (d->d_ops).d_getopt;
      if ((p_Var1 != (_func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *)0x0) &&
         (iVar3 = (*p_Var1)(d->d_data,name,valp,szp,t), iVar3 != 9)) {
        return iVar3;
      }
      pnVar2 = (d->d_ops).d_options;
      if (pnVar2 != (nni_option *)0x0) {
        __s1 = pnVar2->o_name;
        while (__s1 != (char *)0x0) {
          iVar3 = strcmp(__s1,name);
          if (iVar3 == 0) {
            if (pnVar2->o_get == (_func_int_void_ptr_void_ptr_size_t_ptr_nni_type *)0x0) {
              return 0x19;
            }
            iVar3 = (*pnVar2->o_get)(d->d_data,valp,szp,t);
            return iVar3;
          }
          __s1 = pnVar2[1].o_name;
          pnVar2 = pnVar2 + 1;
        }
      }
      iVar3 = nni_sock_getopt(d->d_sock,name,valp,szp,t);
      return iVar3;
    }
    nni_mtx_lock(&d->d_mtx);
    d_00 = d->d_inirtime;
  }
  iVar3 = nni_copyout_ms(d_00,valp,szp,t);
  nni_mtx_unlock(&d->d_mtx);
  return iVar3;
}

Assistant:

int
nni_dialer_getopt(
    nni_dialer *d, const char *name, void *valp, size_t *szp, nni_type t)
{
	nni_option *o;

	if (strcmp(name, NNG_OPT_RECONNMAXT) == 0) {
		int rv;
		nni_mtx_lock(&d->d_mtx);
		rv = nni_copyout_ms(d->d_maxrtime, valp, szp, t);
		nni_mtx_unlock(&d->d_mtx);
		return (rv);
	}
	if (strcmp(name, NNG_OPT_RECONNMINT) == 0) {
		int rv;
		nni_mtx_lock(&d->d_mtx);
		rv = nni_copyout_ms(d->d_inirtime, valp, szp, t);
		nni_mtx_unlock(&d->d_mtx);
		return (rv);
	}

	if (d->d_ops.d_getopt != NULL) {
		int rv = d->d_ops.d_getopt(d->d_data, name, valp, szp, t);
		if (rv != NNG_ENOTSUP) {
			return (rv);
		}
	}
	for (o = d->d_ops.d_options; o && o->o_name; o++) {
		if (strcmp(o->o_name, name) != 0) {
			continue;
		}
		if (o->o_get == NULL) {
			return (NNG_EWRITEONLY);
		}
		return (o->o_get(d->d_data, valp, szp, t));
	}

	return (nni_sock_getopt(d->d_sock, name, valp, szp, t));
}